

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem-test.c++
# Opt level: O2

void __thiscall kj::anon_unknown_0::TestCase754::run(TestCase754 *this)

{
  bool bVar1;
  Own<kj::Directory> OVar2;
  StringPtr text;
  Own<const_kj::File> file;
  Array<kj::String> local_58;
  Own<kj::Directory> dir;
  StringPtr local_30;
  TestClock clock;
  
  clock.super_Clock._vptr_Clock = (_func_int **)&PTR_now_00422458;
  clock.time.value.value = (Quantity<long,_kj::_::NanosecondLabel>)1000000000;
  OVar2 = newInMemoryDirectory((kj *)&dir,&clock.super_Clock);
  (*((dir.ptr)->super_ReadableDirectory).super_FsNode._vptr_FsNode[0xf])(&file,dir.ptr,OVar2.ptr);
  text.content.size_ = 7;
  text.content.ptr = "foobar";
  File::writeAll(file.ptr,text);
  ReadableFile::readAllText((String *)&local_58,&(file.ptr)->super_ReadableFile);
  local_30.content.ptr = "foobar";
  local_30.content.size_ = 7;
  bVar1 = String::operator==((String *)&local_58,&local_30);
  Array<char>::~Array((Array<char> *)&local_58);
  if (!bVar1 && _::Debug::minSeverity < 3) {
    _::Debug::log<char_const(&)[49]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem-test.c++"
               ,0x2f8,ERROR,"\"failed: expected \" \"file->readAllText() == \\\"foobar\\\"\"",
               (char (*) [49])"failed: expected file->readAllText() == \"foobar\"");
  }
  (*((dir.ptr)->super_ReadableDirectory).super_FsNode._vptr_FsNode[6])(&local_58);
  Array<kj::String>::~Array(&local_58);
  if ((local_58.size_ != 0) && (_::Debug::minSeverity < 3)) {
    _::Debug::log<char_const(&)[45]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem-test.c++"
               ,0x2f9,ERROR,"\"failed: expected \" \"dir->listNames() == nullptr\"",
               (char (*) [45])"failed: expected dir->listNames() == nullptr");
  }
  Own<const_kj::File>::dispose(&file);
  Own<kj::Directory>::dispose(&dir);
  return;
}

Assistant:

void tick() {
    time += 1 * SECONDS;
  }